

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.cpp
# Opt level: O2

void __thiscall HashTable<int>::~HashTable(HashTable<int> *this)

{
  node *pnVar1;
  node *pnVar2;
  int i;
  long lVar3;
  
  for (lVar3 = 0; lVar3 != 0x14; lVar3 = lVar3 + 1) {
    pnVar2 = this->HashArray[lVar3].next;
    if (pnVar2 != (node *)0x0) {
      while (pnVar1 = pnVar2->next, pnVar1 != (node *)0x0) {
        operator_delete(pnVar2);
        pnVar2 = pnVar1;
      }
    }
  }
  return;
}

Assistant:

~HashTable() {
		Node *p, *pp;
		for (int i = 0; i < 20; i++) {
			if (HashArray[i].next != NULL) {
				p = pp = HashArray[i].next;
				while (p->next != NULL) {
					pp = p;
					p = p->next;
					delete pp;
				}
			}
		}
	}